

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O2

void __thiscall
libDAI::VarSet::VarSet(VarSet *this,vector<libDAI::Var,_std::allocator<libDAI::Var>_> *ns)

{
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> __first;
  
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (&this->_vars,
             (long)(ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 4);
  std::vector<libDAI::Var,std::allocator<libDAI::Var>>::
  insert<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,void>
            ((vector<libDAI::Var,std::allocator<libDAI::Var>> *)this,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (ns->super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  std::
  __sort<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish);
  __first = std::
            __unique<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::erase
            (&this->_vars,(const_iterator)__first._M_current,
             (this->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
             super__Vector_impl_data._M_finish);
  calcStateSpace(this);
  return;
}

Assistant:

VarSet( const std::vector<Var> &ns ) {
                _vars.reserve( ns.size() );
                _vars.insert( _vars.begin(), ns.begin(), ns.end() );
                std::sort( _vars.begin(), _vars.end() );
                std::vector<Var>::iterator new_end = std::unique( _vars.begin(), _vars.end() );
                _vars.erase( new_end, _vars.end() );
                calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
            }